

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QUtil.cc
# Opt level: O2

int call_main_from_wmain
              (bool param_1,int argc,wchar_t **argv,function<int_(int,_char_**)> *realmain)

{
  wchar_t wVar1;
  wchar_t *__s;
  pointer pbVar2;
  int iVar3;
  unsigned_long __n;
  size_t sVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *arg;
  pointer pbVar5;
  long lVar6;
  undefined4 in_register_00000034;
  undefined7 in_register_00000039;
  size_t j;
  ulong uVar7;
  int argc_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  utf8_argv;
  vector<char_*,_std::allocator<char_*>_> new_argv;
  string local_50;
  
  argc_local = (int)CONCAT71(in_register_00000039,param_1);
  utf8_argv.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  utf8_argv.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  utf8_argv.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __n = QIntC::IntConverter<int,_unsigned_long,_true,_false>::convert(&argc_local);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::reserve(&utf8_argv,__n);
  for (lVar6 = 0; lVar6 < argc_local; lVar6 = lVar6 + 1) {
    new_argv.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)&new_argv.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage;
    new_argv.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    new_argv.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage =
         (pointer)((ulong)new_argv.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage & 0xffffffffffffff00);
    uVar7 = 0;
    while( true ) {
      __s = *(wchar_t **)(CONCAT44(in_register_00000034,argc) + lVar6 * 8);
      sVar4 = wcslen(__s);
      if (sVar4 <= uVar7) break;
      wVar1 = __s[uVar7];
      local_50._M_dataplus._M_p =
           (pointer)(CONCAT44(local_50._M_dataplus._M_p._4_4_,(uint)wVar1 >> 8) & 0xffffffff000000ff
                    );
      QIntC::IntConverter<int,_unsigned_char,_true,_false>::convert((int *)&local_50);
      std::__cxx11::string::append((ulong)&new_argv,'\x01');
      local_50._M_dataplus._M_p =
           (pointer)(CONCAT44(local_50._M_dataplus._M_p._4_4_,wVar1) & 0xffffffff000000ff);
      QIntC::IntConverter<int,_unsigned_char,_true,_false>::convert((int *)&local_50);
      std::__cxx11::string::append((ulong)&new_argv,'\x01');
      uVar7 = uVar7 + 1;
    }
    QUtil::utf16_to_utf8(&local_50,(string *)&new_argv);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&utf8_argv,
               &local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&new_argv);
  }
  new_argv.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  new_argv.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  new_argv.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<char_*,_std::allocator<char_*>_>::reserve
            (&new_argv,
             ((long)utf8_argv.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)utf8_argv.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 5) + 1);
  pbVar2 = utf8_argv.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar5 = utf8_argv.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pbVar5 != pbVar2; pbVar5 = pbVar5 + 1) {
    local_50._M_dataplus._M_p = (pbVar5->_M_dataplus)._M_p;
    std::vector<char*,std::allocator<char*>>::emplace_back<char*>
              ((vector<char*,std::allocator<char*>> *)&new_argv,(char **)&local_50);
  }
  local_50._M_dataplus._M_p =
       (pointer)((long)utf8_argv.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)utf8_argv.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 5);
  argc_local = QIntC::IntConverter<unsigned_long,_int,_false,_true>::convert
                         ((unsigned_long *)&local_50);
  local_50._M_dataplus._M_p = (pointer)0x0;
  std::vector<char*,std::allocator<char*>>::emplace_back<decltype(nullptr)>
            ((vector<char*,std::allocator<char*>> *)&new_argv,(void **)&local_50);
  iVar3 = std::function<int_(int,_char_**)>::operator()
                    ((function<int_(int,_char_**)> *)argv,argc_local,
                     new_argv.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                     super__Vector_impl_data._M_start);
  std::_Vector_base<char_*,_std::allocator<char_*>_>::~_Vector_base
            (&new_argv.super__Vector_base<char_*,_std::allocator<char_*>_>);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&utf8_argv);
  return iVar3;
}

Assistant:

static int
call_main_from_wmain(
    bool, int argc, wchar_t const* const argv[], std::function<int(int, char*[])> realmain)
{
    // argv contains UTF-16-encoded strings with a 16-bit wchar_t. Convert this to UTF-8-encoded
    // strings for compatibility with other systems. That way the rest of qpdf.cc can just act like
    // arguments are UTF-8.

    std::vector<std::string> utf8_argv;
    utf8_argv.reserve(QIntC::to_size(argc));
    for (int i = 0; i < argc; ++i) {
        std::string utf16;
        for (size_t j = 0; j < std::wcslen(argv[i]); ++j) {
            unsigned short codepoint = static_cast<unsigned short>(argv[i][j]);
            utf16.append(1, static_cast<char>(QIntC::to_uchar(codepoint >> 8)));
            utf16.append(1, static_cast<char>(QIntC::to_uchar(codepoint & 0xff)));
        }
        utf8_argv.emplace_back(QUtil::utf16_to_utf8(utf16));
    }
    std::vector<char*> new_argv;
    new_argv.reserve(utf8_argv.size() + 1U);
    for (auto const& arg: utf8_argv) {
        new_argv.emplace_back(const_cast<char*>(arg.data()));
    }
    argc = QIntC::to_int(utf8_argv.size());
    new_argv.emplace_back(nullptr);
    return realmain(argc, new_argv.data());
}